

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O1

int __thiscall Server::Private::remove(Private *this,char *__filename)

{
  usize *puVar1;
  Item *pIVar2;
  Item *pIVar3;
  Item *pIVar4;
  Item *pIVar5;
  long lVar6;
  bool bVar7;
  Item *local_18;
  
  local_18 = (this->_queuedTimers).root;
  bVar7 = local_18 == (Item *)0x0;
  if (!bVar7) {
    bVar7 = false;
    do {
      lVar6 = 0x20;
      if ((*(long *)(__filename + 8) <= local_18->key) &&
         (lVar6 = 0x18, local_18->key <= *(long *)(__filename + 8))) break;
      local_18 = *(Item **)((long)&local_18->key + lVar6);
      bVar7 = local_18 == (Item *)0x0;
    } while (!bVar7);
  }
  pIVar2 = (this->_queuedTimers)._end.item;
  if (bVar7) {
    local_18 = pIVar2;
  }
  if (local_18 != pIVar2) {
    while (local_18->value != (TimerImpl *)__filename) {
      if ((local_18->key != *(long *)(__filename + 8)) ||
         (local_18 = local_18->next, local_18 == pIVar2)) goto LAB_0010e28a;
    }
    MultiMap<long,_Server::Private::TimerImpl_*>::remove(&this->_queuedTimers,(char *)&local_18);
  }
LAB_0010e28a:
  pIVar3 = *(Item **)(__filename + -0x10);
  pIVar4 = *(Item **)(__filename + -8);
  pIVar5 = pIVar3;
  if (pIVar3 == (Item *)0x0) {
    pIVar5 = (Item *)&this->_timers;
  }
  ((Iterator *)&pIVar5->next)->item = pIVar4;
  pIVar4->prev = pIVar3;
  puVar1 = &(this->_timers)._size;
  *puVar1 = *puVar1 - 1;
  *(Item **)(__filename + -0x10) = (this->_timers).freeItem;
  (this->_timers).freeItem = (Item *)(__filename + -0x10);
  return (int)(Item *)(__filename + -0x10);
}

Assistant:

void Server::Private::remove(TimerImpl &timer)
{
  for (MultiMap<int64, TimerImpl *>::Iterator i = _queuedTimers.find(timer.executionTime), end = _queuedTimers.end(); i != end; ++i)
  {
    if (*i == &timer)
    {
      _queuedTimers.remove(i);
      break;
    }
    if (i.key() != timer.executionTime)
      break;
  }
  _timers.remove(timer);
}